

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv.cc
# Opt level: O1

Status __thiscall
leveldb::anon_unknown_2::InMemoryEnv::GetChildren
          (InMemoryEnv *this,string *dir,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *result)

{
  _Base_ptr __n;
  void *__s1;
  int iVar1;
  _Rb_tree_node_base *p_Var2;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&dir->field_2);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)in_RCX);
  for (p_Var2 = (_Rb_tree_node_base *)dir[2].field_2._M_allocated_capacity;
      p_Var2 != (_Rb_tree_node_base *)(dir + 2);
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    __n = (_Base_ptr)
          (result->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish;
    if (((_Base_ptr)((long)&__n->_M_color + 1U) <= p_Var2[1]._M_parent) &&
       (__n <= p_Var2[1]._M_parent)) {
      __s1 = *(void **)(p_Var2 + 1);
      if ((*(char *)((long)__s1 + (long)__n) == '/') &&
         (iVar1 = bcmp(__s1,(result->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start,(size_t)__n), iVar1 == 0)) {
        std::__cxx11::string::substr((ulong)&local_50,(ulong)(p_Var2 + 1));
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(in_RCX,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
      }
    }
  }
  (this->super_EnvWrapper).super_Env._vptr_Env = (_func_int **)0x0;
  pthread_mutex_unlock((pthread_mutex_t *)&dir->field_2);
  return (Status)(char *)this;
}

Assistant:

Status GetChildren(const std::string& dir,
                     std::vector<std::string>* result) override {
    MutexLock lock(&mutex_);
    result->clear();

    for (const auto& kvp : file_map_) {
      const std::string& filename = kvp.first;

      if (filename.size() >= dir.size() + 1 && filename[dir.size()] == '/' &&
          Slice(filename).starts_with(Slice(dir))) {
        result->push_back(filename.substr(dir.size() + 1));
      }
    }

    return Status::OK();
  }